

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# googletest.h
# Opt level: O2

void * operator_new(size_t size)

{
  void *pvVar1;
  undefined8 *puVar2;
  
  pvVar1 = operator_new(size,(nothrow_t *)&std::nothrow);
  if (pvVar1 != (void *)0x0) {
    return pvVar1;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = pthread_rwlock_rdlock;
  __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

void* operator new(size_t size) GOOGLE_GLOG_THROW_BAD_ALLOC {
  void* p = ::operator new(size, std::nothrow);
  if (p == nullptr) {
    throw std::bad_alloc{};
  }
  return p;
}